

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::ReadPixels::ReadPixels
          (ReadPixels *this,int x,int y,int width,int height,GLenum format,GLenum type,
          SharedPtr<tcu::ThreadUtil::DataBlock> *data,bool useSync,bool serverSync)

{
  DataBlock *this_00;
  undefined1 local_58 [50];
  undefined1 local_26;
  undefined1 local_25;
  GLenum local_24;
  bool serverSync_local;
  int iStack_20;
  bool useSync_local;
  GLenum format_local;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  ReadPixels *this_local;
  
  local_25 = useSync;
  local_26 = serverSync;
  local_24 = format;
  iStack_20 = height;
  format_local = width;
  height_local = y;
  width_local = x;
  _y_local = this;
  Operation::Operation(&this->super_Operation,"ReadPixels",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation = (_func_int **)&PTR__ReadPixels_00670420;
  this->m_x = width_local;
  this->m_y = height_local;
  this->m_width = format_local;
  this->m_height = iStack_20;
  this->m_format = local_24;
  this->m_type = type;
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr(&this->m_data);
  this_00 = (DataBlock *)operator_new(0x50);
  tcu::ThreadUtil::Operation::getEvent((Operation *)local_58);
  tcu::ThreadUtil::DataBlock::DataBlock(this_00,(SharedPtr<tcu::ThreadUtil::Event> *)local_58);
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
            ((SharedPtr<tcu::ThreadUtil::DataBlock> *)(local_58 + 0x10),this_00);
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::operator=
            (data,(SharedPtr<tcu::ThreadUtil::DataBlock> *)(local_58 + 0x10));
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr
            ((SharedPtr<tcu::ThreadUtil::DataBlock> *)(local_58 + 0x10));
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr((SharedPtr<tcu::ThreadUtil::Event> *)local_58);
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::operator=(&this->m_data,data);
  return;
}

Assistant:

ReadPixels::ReadPixels (int x, int y, int width, int height, GLenum format, GLenum type, SharedPtr<tcu::ThreadUtil::DataBlock>& data, bool useSync, bool serverSync)
	: Operation	("ReadPixels", useSync, serverSync)
	, m_x		(x)
	, m_y		(y)
	, m_width	(width)
	, m_height	(height)
	, m_format	(format)
	, m_type	(type)
{
	data = SharedPtr<tcu::ThreadUtil::DataBlock>(new tcu::ThreadUtil::DataBlock(getEvent()));
	m_data = data;
}